

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

int nghttp2_check_header_name(uint8_t *name,size_t len)

{
  uint8_t *puVar1;
  uint8_t *last;
  size_t len_local;
  uint8_t *name_local;
  int local_4;
  
  if (len == 0) {
    local_4 = 0;
  }
  else {
    len_local = len;
    name_local = name;
    if (*name == ':') {
      if (len == 1) {
        return 0;
      }
      name_local = name + 1;
      len_local = len - 1;
    }
    puVar1 = name_local + len_local;
    for (; name_local != puVar1; name_local = name_local + 1) {
      if (VALID_HD_NAME_CHARS[*name_local] == 0) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int nghttp2_check_header_name(const uint8_t *name, size_t len) {
  const uint8_t *last;
  if (len == 0) {
    return 0;
  }
  if (*name == ':') {
    if (len == 1) {
      return 0;
    }
    ++name;
    --len;
  }
  for (last = name + len; name != last; ++name) {
    if (!VALID_HD_NAME_CHARS[*name]) {
      return 0;
    }
  }
  return 1;
}